

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void libtorrent::stat_file(string *inf,file_status *s,error_code *ec,file_status_flag_t flags)

{
  int val;
  bool bVar1;
  char *pcVar2;
  int *piVar3;
  error_category *cat;
  bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void> local_100;
  bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void> local_fc;
  bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void> local_f8;
  bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void> local_f4;
  uint local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  uint local_e4;
  uint local_e0;
  int local_dc;
  undefined1 local_d8 [4];
  int retval;
  stat ret;
  native_path_string f;
  error_code *ec_local;
  file_status *s_local;
  string *inf_local;
  file_status_flag_t flags_local;
  
  boost::system::error_code::clear(ec);
  convert_to_native_path_string((native_path_string *)(ret.__glibc_reserved + 2),inf);
  memset(local_d8,0,0x90);
  local_e8 = 1;
  local_e4 = flags.m_val;
  local_e0 = (uint)libtorrent::flags::operator&
                             (flags.m_val,
                              (bitfield_flag<unsigned_int,_libtorrent::file_status_flag_tag,_void>)
                              0x1);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_e0);
  if (bVar1) {
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    local_dc = lstat64(pcVar2,(stat64 *)local_d8);
  }
  else {
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    local_dc = stat64(pcVar2,(stat64 *)local_d8);
  }
  if (local_dc < 0) {
    piVar3 = __errno_location();
    val = *piVar3;
    cat = boost::system::system_category();
    boost::system::error_code::assign(ec,val,cat);
    local_ec = 1;
  }
  else {
    s->file_size = ret.st_rdev;
    s->atime = ret.st_blocks;
    s->mtime = ret.st_atim.tv_nsec;
    s->ctime = ret.st_mtim.tv_nsec;
    if (((uint)ret.st_nlink & 0xf000) == 0x4000) {
      local_f8.m_val = 1;
    }
    else {
      libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void>::
      bitfield_flag(&local_f8);
    }
    if (((uint)ret.st_nlink & 0xf000) == 0xa000) {
      local_fc.m_val = 8;
    }
    else {
      libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void>::
      bitfield_flag(&local_fc);
    }
    local_f4 = libtorrent::flags::operator|(local_f8,local_fc);
    if (((uint)ret.st_nlink & 0x40) == 0) {
      libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::file_attribute_tag,_void>::
      bitfield_flag(&local_100);
    }
    else {
      local_100.m_val = 4;
    }
    local_f0 = (uint)libtorrent::flags::operator|(local_f4,local_100);
    (s->mode).m_val = local_f0;
    local_ec = 0;
  }
  ::std::__cxx11::string::~string((string *)(ret.__glibc_reserved + 2));
  return;
}

Assistant:

void stat_file(std::string const& inf, file_status* s
		, error_code& ec, file_status_flag_t const flags)
	{
		ec.clear();
		native_path_string f = convert_to_native_path_string(inf);
#ifdef TORRENT_WINDOWS

		WIN32_FILE_ATTRIBUTE_DATA data;
		if (!GetFileAttributesExW(f.c_str(), GetFileExInfoStandard, &data))
		{
			ec.assign(GetLastError(), system_category());
			TORRENT_ASSERT(ec);
			return;
		}

		// Fallback to GetFileInformationByHandle for symlinks
		if (!(flags & dont_follow_links) && (data.dwFileAttributes & FILE_ATTRIBUTE_REPARSE_POINT))
		{
#ifdef TORRENT_WINRT

			CREATEFILE2_EXTENDED_PARAMETERS Extended
			{
				sizeof(CREATEFILE2_EXTENDED_PARAMETERS),
				0, // no file attributes
				FILE_FLAG_BACKUP_SEMANTICS // in order to open a directory, we need the FILE_FLAG_BACKUP_SEMANTICS
			};

			const auto h = CreateFile2(f.c_str(), 0, FILE_SHARE_DELETE | FILE_SHARE_READ
				| FILE_SHARE_WRITE, OPEN_EXISTING, &Extended);

			if (h == INVALID_HANDLE_VALUE)
			{
				ec.assign(GetLastError(), system_category());
				TORRENT_ASSERT(ec);
				return;
			}

			FILE_BASIC_INFO Basic;
			FILE_STANDARD_INFO Standard;

			if (
				!GetFileInformationByHandleEx(h, FILE_INFO_BY_HANDLE_CLASS::FileBasicInfo, &Basic, sizeof(FILE_BASIC_INFO)) ||
				!GetFileInformationByHandleEx(h, FILE_INFO_BY_HANDLE_CLASS::FileStandardInfo, &Standard, sizeof(FILE_STANDARD_INFO))
			)
			{
				ec.assign(GetLastError(), system_category());
				TORRENT_ASSERT(ec);
				CloseHandle(h);
				return;
			}
			CloseHandle(h);

			fill_file_status(*s, Standard.EndOfFile, Basic.FileAttributes, Basic.CreationTime, Basic.LastAccessTime, Basic.LastWriteTime);
			return;

#else

			// in order to open a directory, we need the FILE_FLAG_BACKUP_SEMANTICS
			HANDLE h = CreateFileW(f.c_str(), 0, FILE_SHARE_DELETE | FILE_SHARE_READ
				| FILE_SHARE_WRITE, nullptr, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, nullptr);
			if (h == INVALID_HANDLE_VALUE)
			{
				ec.assign(GetLastError(), system_category());
				TORRENT_ASSERT(ec);
				return;
			}

			BY_HANDLE_FILE_INFORMATION handle_data;
			if (!GetFileInformationByHandle(h, &handle_data))
			{
				ec.assign(GetLastError(), system_category());
				TORRENT_ASSERT(ec);
				CloseHandle(h);
				return;
			}
			CloseHandle(h);

			fill_file_status(*s, handle_data.nFileSizeLow, handle_data.nFileSizeHigh, handle_data.dwFileAttributes, handle_data.ftCreationTime, handle_data.ftLastAccessTime, handle_data.ftLastWriteTime);
			return;

#endif
		}

		fill_file_status(*s, data.nFileSizeLow, data.nFileSizeHigh, data.dwFileAttributes, data.ftCreationTime, data.ftLastAccessTime, data.ftLastWriteTime);

#else

		// posix version

		struct ::stat ret{};
		int retval;
		if (flags & dont_follow_links)
			retval = ::lstat(f.c_str(), &ret);
		else
			retval = ::stat(f.c_str(), &ret);
		if (retval < 0)
		{
			ec.assign(errno, system_category());
			return;
		}

		// make sure the _FILE_OFFSET_BITS define worked
		// on this platform. It's supposed to make file
		// related functions support 64-bit offsets.
		static_assert(sizeof(ret.st_size) >= 8, "64 bit file operations are required");

		s->file_size = ret.st_size;
		s->atime = std::uint64_t(ret.st_atime);
		s->mtime = std::uint64_t(ret.st_mtime);
		s->ctime = std::uint64_t(ret.st_ctime);

		s->mode = (S_ISDIR(ret.st_mode) ? file_status::directory : file_attributes_t{})
			| (S_ISLNK(ret.st_mode) ? file_status::symlink : file_attributes_t{})
			| ((ret.st_mode & S_IXUSR) ? file_status::executable : file_attributes_t{})
		;

#endif // TORRENT_WINDOWS
	}